

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devicehandlerlist_p.h
# Opt level: O0

void __thiscall
QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::add
          (DeviceHandlerList<QEvdevTabletHandlerThread> *this,QString *deviceNode,
          unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
          *handler)

{
  long lVar1;
  value_type *in_RDX;
  Device *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(&in_RDI->deviceNode,&in_RDX->deviceNode);
  std::unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>::
  unique_ptr((unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
              *)in_RDI,
             (unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
              *)in_RDX);
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
  ::push_back((vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
               *)in_RDI,in_RDX);
  Device::~Device(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void add(const QString &deviceNode, std::unique_ptr<Handler> handler)
    {
        v.push_back({deviceNode, std::move(handler)});
    }